

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chainparams.cpp
# Opt level: O3

CBlock * CreateGenesisBlock(CBlock *__return_storage_ptr__,uint32_t nTime,uint32_t nNonce,
                           uint32_t nBits,int32_t nVersion,CAmount *genesisReward)

{
  uint uVar1;
  uint uVar2;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *this;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *ppVar3;
  long in_FS_OFFSET;
  span<const_std::byte,_18446744073709551615UL> b;
  undefined2 in_stack_ffffffffffffff44;
  uchar uVar4;
  byte in_stack_ffffffffffffff47;
  undefined1 local_78 [28];
  uint uStack_5c;
  direct_or_indirect local_58;
  uint local_3c;
  CBlock *local_38;
  
  local_38 = *(CBlock **)(in_FS_OFFSET + 0x28);
  local_78._16_8_ = 0;
  stack0xffffffffffffffa0 = 0;
  local_78._0_8_ = (char *)0x0;
  local_78._8_8_ = 0;
  memcpy(&stack0xffffffffffffff47,util::hex_literals::detail::Hex<131ul>{std::array<std::byte_65ul>,
         0x41);
  b._M_extent._M_extent_value = 0x41;
  b._M_ptr = &stack0xffffffffffffff47;
  this = &CScript::operator<<((CScript *)local_78,b)->super_CScriptBase;
  uVar1 = this->_size;
  uVar2 = uVar1 - 0x1d;
  if (uVar1 < 0x1d) {
    uVar2 = uVar1;
  }
  ppVar3 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
           (this->_union).indirect_contents.indirect;
  if (uVar1 < 0x1d) {
    ppVar3 = this;
  }
  uVar4 = 0xac;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            (this,(uchar *)((long)&ppVar3->_union + (long)(int)uVar2),&stack0xffffffffffffff46);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&local_58.indirect_contents,this);
  if (0x1c < uStack_5c) {
    free((void *)local_78._0_8_);
  }
  CreateGenesisBlock(__return_storage_ptr__,
                     "The Times 03/Jan/2009 Chancellor on brink of second bailout for banks",
                     (CScript *)&local_58.indirect_contents,nTime,nNonce,nBits,nVersion,
                     (CAmount *)
                     CONCAT17(in_stack_ffffffffffffff47,
                              CONCAT16(uVar4,CONCAT24(in_stack_ffffffffffffff44,nBits))));
  if (0x1c < local_3c) {
    free(local_58.indirect_contents.indirect);
  }
  if (*(CBlock **)(in_FS_OFFSET + 0x28) == local_38) {
    return *(CBlock **)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

static CBlock CreateGenesisBlock(uint32_t nTime, uint32_t nNonce, uint32_t nBits, int32_t nVersion, const CAmount& genesisReward)
{
    const char* pszTimestamp = "The Times 03/Jan/2009 Chancellor on brink of second bailout for banks";
    const CScript genesisOutputScript = CScript() << "04678afdb0fe5548271967f1a67130b7105cd6a828e03909a67962e0ea1f61deb649f6bc3f4cef38c4f35504e51ec112de5c384df7ba0b8d578a4c702b6bf11d5f"_hex << OP_CHECKSIG;
    return CreateGenesisBlock(pszTimestamp, genesisOutputScript, nTime, nNonce, nBits, nVersion, genesisReward);
}